

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::ReadNodeChannels(BVHLoader *this,Node *pNode)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_> *this_00;
  float fVar4;
  string channelToken;
  string sStack_1e8;
  string local_1c8;
  ChannelType local_1a8 [94];
  
  fVar4 = GetNextTokenAsFloat(this);
  uVar3 = (ulong)fVar4;
  this_00 = &pNode->mChannels;
  do {
    iVar2 = (int)uVar3;
    uVar3 = (ulong)(iVar2 - 1);
    if (iVar2 == 0) {
      return;
    }
    GetNextToken_abi_cxx11_(&local_1c8,this);
    bVar1 = std::operator==(&local_1c8,"Xposition");
    if (bVar1) {
      local_1a8[0] = Channel_PositionX;
      std::vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>::
      emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
    }
    else {
      bVar1 = std::operator==(&local_1c8,"Yposition");
      if (bVar1) {
        local_1a8[0] = Channel_PositionY;
        std::vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
        ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
      }
      else {
        bVar1 = std::operator==(&local_1c8,"Zposition");
        if (bVar1) {
          local_1a8[0] = Channel_PositionZ;
          std::
          vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>::
          emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
        }
        else {
          bVar1 = std::operator==(&local_1c8,"Xrotation");
          if (bVar1) {
            local_1a8[0] = Channel_RotationX;
            std::
            vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
            ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
          }
          else {
            bVar1 = std::operator==(&local_1c8,"Yrotation");
            if (bVar1) {
              local_1a8[0] = Channel_RotationY;
              std::
              vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
              ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
            }
            else {
              bVar1 = std::operator==(&local_1c8,"Zrotation");
              if (!bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::operator<<((ostream *)local_1a8,"Invalid channel specifier \"");
                std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
                std::operator<<((ostream *)local_1a8,"\".");
                std::__cxx11::stringbuf::str();
                ThrowException(this,&sStack_1e8);
              }
              local_1a8[0] = Channel_RotationZ;
              std::
              vector<Assimp::BVHLoader::ChannelType,_std::allocator<Assimp::BVHLoader::ChannelType>_>
              ::emplace_back<Assimp::BVHLoader::ChannelType>(this_00,local_1a8);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_1c8);
  } while( true );
}

Assistant:

void BVHLoader::ReadNodeChannels( BVHLoader::Node& pNode)
{
    // number of channels. Use the float reader because we're lazy
    float numChannelsFloat = GetNextTokenAsFloat();
    unsigned int numChannels = (unsigned int) numChannelsFloat;

    for( unsigned int a = 0; a < numChannels; a++)
    {
        std::string channelToken = GetNextToken();

        if( channelToken == "Xposition")
            pNode.mChannels.push_back( Channel_PositionX);
        else if( channelToken == "Yposition")
            pNode.mChannels.push_back( Channel_PositionY);
        else if( channelToken == "Zposition")
            pNode.mChannels.push_back( Channel_PositionZ);
        else if( channelToken == "Xrotation")
            pNode.mChannels.push_back( Channel_RotationX);
        else if( channelToken == "Yrotation")
            pNode.mChannels.push_back( Channel_RotationY);
        else if( channelToken == "Zrotation")
            pNode.mChannels.push_back( Channel_RotationZ);
        else
            ThrowException( format() << "Invalid channel specifier \"" << channelToken << "\"." );
    }
}